

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O0

int main(void)

{
  int iVar1;
  int iVar2;
  undefined4 local_74;
  undefined1 local_70 [4];
  int timeo;
  nn_thread thread3;
  nn_thread thread2;
  nn_thread thread1;
  int ende2;
  int ende1;
  int endd;
  int endc;
  int endb;
  int enda;
  
  nn_thread_init((nn_thread *)&thread2.handle,device1,(void *)0x0);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0x76,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x77,iVar1,"inproc://a");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0x78,1,0x10);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x79,iVar2,"inproc://b");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x7c,iVar1,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x7d,iVar2,"ABC");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x7e,iVar2,"ABC");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x7f,iVar1,"ABC");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0x82,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0x83,iVar1);
  nn_thread_init((nn_thread *)&thread3.handle,device2,(void *)0x0);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0x8b,1,0x50);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x8c,iVar1,"inproc://c");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0x8d,1,0x51);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x8e,iVar2,"inproc://d");
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x91,iVar1,"XYZ");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0x92,iVar2,"XYZ");
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0x95,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0x96,iVar1);
  nn_thread_init((nn_thread *)local_70,device3,(void *)0x0);
  iVar1 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0x9e,1,0x70);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0x9f,iVar1,"inproc://e");
  iVar2 = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                           ,0xa0,1,0x70);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                    ,0xa1,iVar2,"inproc://e");
  nn_sleep(100);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0xa7,iVar1,"KLM");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0xa8,iVar2,"KLM");
  local_74 = 100;
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
             ,0xae,iVar1,0,5,&local_74,4);
  test_drop_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                 ,0xaf,iVar1,0x6e);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0xb2,iVar2);
  test_close_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/device.c"
                  ,0xb3,iVar1);
  nn_term();
  nn_thread_term((nn_thread *)&thread2.handle);
  nn_thread_term((nn_thread *)&thread3.handle);
  nn_thread_term((nn_thread *)local_70);
  return 0;
}

Assistant:

int main ()
{
    int enda;
    int endb;
    int endc;
    int endd;
    int ende1;
    int ende2;
    struct nn_thread thread1;
    struct nn_thread thread2;
    struct nn_thread thread3;
    int timeo;

    /*  Test the bi-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread1, device1, NULL);

    /*  Create two sockets to connect to the device. */
    enda = test_socket (AF_SP, NN_PAIR);
    test_connect (enda, SOCKET_ADDRESS_A);
    endb = test_socket (AF_SP, NN_PAIR);
    test_connect (endb, SOCKET_ADDRESS_B);

    /*  Pass a pair of messages between endpoints. */
    test_send (enda, "ABC");
    test_recv (endb, "ABC");
    test_send (endb, "ABC");
    test_recv (enda, "ABC");

    /*  Clean up. */
    test_close (endb);
    test_close (enda);

    /*  Test the uni-directional device. */

    /*  Start the device. */
    nn_thread_init (&thread2, device2, NULL);

    /*  Create two sockets to connect to the device. */
    endc = test_socket (AF_SP, NN_PUSH);
    test_connect (endc, SOCKET_ADDRESS_C);
    endd = test_socket (AF_SP, NN_PULL);
    test_connect (endd, SOCKET_ADDRESS_D);

    /*  Pass a message between endpoints. */
    test_send (endc, "XYZ");
    test_recv (endd, "XYZ");

    /*  Clean up. */
    test_close (endd);
    test_close (endc);

    /*  Test the loopback device. */

    /*  Start the device. */
    nn_thread_init (&thread3, device3, NULL);

    /*  Create two sockets to connect to the device. */
    ende1 = test_socket (AF_SP, NN_BUS);
    test_connect (ende1, SOCKET_ADDRESS_E);
    ende2 = test_socket (AF_SP, NN_BUS);
    test_connect (ende2, SOCKET_ADDRESS_E);

    /*  BUS is unreliable so wait a bit for connections to be established. */
    nn_sleep (100);

    /*  Pass a message to the bus. */
    test_send (ende1, "KLM");
    test_recv (ende2, "KLM");

    /*  Make sure that the message doesn't arrive at the socket it was
        originally sent to. */
    timeo = 100;
    test_setsockopt (ende1, NN_SOL_SOCKET, NN_RCVTIMEO,
       &timeo, sizeof (timeo));
    test_drop (ende1, ETIMEDOUT);

    /*  Clean up. */
    test_close (ende2);
    test_close (ende1);

    /*  Shut down the devices. */
    nn_term ();
    nn_thread_term (&thread1);
    nn_thread_term (&thread2);
    nn_thread_term (&thread3);

    return 0;
}